

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O0

void __thiscall btSparseSdf<3>::BuildCell(btSparseSdf<3> *this,Cell *c)

{
  btScalar *pbVar1;
  long in_RSI;
  long in_RDI;
  float fVar2;
  btScalar bVar3;
  btVector3 bVar4;
  btScalar x;
  int i;
  btScalar y;
  int j;
  btScalar z;
  int k;
  btVector3 org;
  undefined4 in_stack_ffffffffffffff68;
  float fVar5;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  btVector3 local_78;
  float local_68;
  int local_64;
  float local_60;
  int local_5c;
  float local_58;
  int local_54;
  undefined4 local_50;
  float local_4c;
  float local_48;
  float local_44;
  btVector3 local_40;
  btVector3 local_20;
  long local_10;
  
  local_44 = (float)*(int *)(in_RSI + 0x100);
  local_48 = (float)*(int *)(in_RSI + 0x104);
  local_4c = (float)*(int *)(in_RSI + 0x108);
  local_10 = in_RSI;
  btVector3::btVector3(&local_40,&local_44,&local_48,&local_4c);
  local_50 = 0x40400000;
  bVar4 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (btScalar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_20 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (btScalar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
    fVar5 = *(float *)(in_RDI + 0x20);
    fVar2 = (float)local_54;
    pbVar1 = btVector3::z(&local_20);
    local_58 = fVar5 * fVar2 + *pbVar1;
    for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
      fVar5 = *(float *)(in_RDI + 0x20);
      fVar2 = (float)local_5c;
      pbVar1 = btVector3::y(&local_20);
      local_60 = fVar5 * fVar2 + *pbVar1;
      for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
        fVar5 = *(float *)(in_RDI + 0x20);
        fVar2 = (float)local_64;
        pbVar1 = btVector3::x(&local_20);
        local_68 = fVar5 * fVar2 + *pbVar1;
        btVector3::btVector3(&local_78,&local_68,&local_60,&local_58);
        bVar3 = DistanceToShape(bVar4.m_floats._8_8_,bVar4.m_floats._0_8_);
        *(btScalar *)(local_10 + (long)local_64 * 0x40 + (long)local_5c * 0x10 + (long)local_54 * 4)
             = bVar3;
      }
    }
  }
  return;
}

Assistant:

void					BuildCell(Cell& c)
	{
		const btVector3	org=btVector3(	(btScalar)c.c[0],
			(btScalar)c.c[1],
			(btScalar)c.c[2])	*
			CELLSIZE*voxelsz;
		for(int k=0;k<=CELLSIZE;++k)
		{
			const btScalar	z=voxelsz*k+org.z();
			for(int j=0;j<=CELLSIZE;++j)
			{
				const btScalar	y=voxelsz*j+org.y();
				for(int i=0;i<=CELLSIZE;++i)
				{
					const btScalar	x=voxelsz*i+org.x();
					c.d[i][j][k]=DistanceToShape(	btVector3(x,y,z),
						c.pclient);
				}
			}
		}
	}